

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugRenderViewportThumbnail(ImDrawList *draw_list,ImGuiViewportP *viewport,ImRect *bb)

{
  undefined8 *puVar1;
  ImVec2 IVar2;
  ImDrawList *pIVar3;
  ImGuiWindow *pIVar4;
  ImFont *font;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  ImGuiContext *pIVar16;
  ImGuiWindow *pIVar17;
  ImVec2 *p_max;
  ImU32 IVar18;
  long lVar19;
  ImGuiWindow **ppIVar20;
  char *text_end;
  uint uVar21;
  ImGuiWindow **ppIVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  float fVar29;
  float fVar31;
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ImVec4 local_d8;
  ImGuiContext *local_c8;
  ImGuiWindow *local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  ImVec2 local_88;
  float fStack_80;
  float fStack_7c;
  ImVec2 local_78;
  undefined8 uStack_70;
  ImDrawList *local_60;
  ImGuiViewportP *local_58;
  ImVec2 *local_50;
  ImGuiWindow **local_48;
  ImVec2 local_40;
  ImVec2 IStack_38;
  
  pIVar16 = GImGui;
  local_c0 = GImGui->CurrentWindow;
  local_88 = bb->Min;
  fStack_80 = 0.0;
  fStack_7c = 0.0;
  _fStack_90 = 0;
  local_98._0_4_ = (bb->Max).x;
  local_98._4_4_ = (bb->Max).y;
  local_78 = (viewport->super_ImGuiViewport).Pos;
  uStack_70 = 0;
  local_a8 = (viewport->super_ImGuiViewport).Size;
  uStack_a0 = 0;
  pIVar3 = local_c0->DrawList;
  local_d8.x = (GImGui->Style).Colors[5].x;
  local_d8.y = (GImGui->Style).Colors[5].y;
  uVar5 = (GImGui->Style).Colors[5].z;
  uVar6 = (GImGui->Style).Colors[5].w;
  local_d8.w = (GImGui->Style).Alpha * 0.4 * (float)uVar6;
  local_d8.z = (float)uVar5;
  local_60 = draw_list;
  local_58 = viewport;
  IVar18 = ColorConvertFloat4ToU32(&local_d8);
  local_50 = &bb->Max;
  ImDrawList::AddRectFilled(pIVar3,&bb->Min,&bb->Max,IVar18,0.0,0);
  pIVar17 = local_c0;
  local_c8 = pIVar16;
  lVar19 = (long)(pIVar16->Windows).Size;
  if (lVar19 != 0) {
    auVar24._0_4_ = (float)local_98._0_4_ - local_88.x;
    auVar24._4_4_ = (float)local_98._4_4_ - local_88.y;
    auVar24._8_4_ = fStack_90 - fStack_80;
    auVar24._12_4_ = fStack_8c - fStack_7c;
    auVar33._8_8_ = uStack_a0;
    auVar33._0_4_ = local_a8.x;
    auVar33._4_4_ = local_a8.y;
    _local_98 = divps(auVar24,auVar33);
    fStack_80 = fStack_80 - (float)uStack_70 * local_98._8_4_;
    fStack_7c = fStack_7c - uStack_70._4_4_ * local_98._12_4_;
    local_88.y = local_88.y - local_78.y * local_98._4_4_;
    local_88.x = local_88.x - local_78.x * local_98._0_4_;
    ppIVar22 = (pIVar16->Windows).Data;
    ppIVar20 = ppIVar22 + lVar19;
    local_a8 = (ImVec2)bb;
    local_48 = ppIVar20;
    do {
      pIVar4 = *ppIVar22;
      if ((pIVar4->WasActive == true) && ((pIVar4->Flags & 0x1000000) == 0)) {
        fVar29 = (pIVar4->Pos).x;
        fVar31 = (pIVar4->Pos).y;
        auVar23._0_4_ = (float)(int)((float)local_98._0_4_ * fVar29 + local_88.x);
        auVar23._4_4_ = (float)(int)((float)local_98._4_4_ * fVar31 + local_88.y);
        auVar23._8_4_ = (float)(int)(fStack_90 * 0.0 + fStack_80);
        auVar23._12_4_ = (float)(int)(fStack_8c * 0.0 + fStack_7c);
        fVar26 = (float)bb->Min;
        fVar27 = (float)((ulong)bb->Min >> 0x20);
        IVar2 = *(ImVec2 *)((long)bb + 8);
        auVar28._8_8_ = 0;
        auVar28._0_4_ = IVar2.x;
        auVar28._4_4_ = IVar2.y;
        auVar32._8_8_ = 0;
        auVar32._0_4_ = IVar2.x;
        auVar32._4_4_ = IVar2.y;
        auVar33 = minps(auVar32,auVar23);
        local_b8 = (ImVec2)(CONCAT44(~-(uint)(auVar23._4_4_ < fVar27) & auVar33._4_4_,
                                     ~-(uint)(auVar23._0_4_ < fVar26) & auVar33._0_4_) |
                           CONCAT44((uint)fVar27 & -(uint)(auVar23._4_4_ < fVar27),
                                    (uint)fVar26 & -(uint)(auVar23._0_4_ < fVar26)));
        auVar30._0_4_ =
             (float)(int)(((pIVar4->Size).x + fVar29) * (float)local_98._0_4_ + local_88.x);
        auVar30._4_4_ =
             (float)(int)(((pIVar4->Size).y + fVar31) * (float)local_98._4_4_ + local_88.y);
        auVar30._8_4_ = (float)(int)(fStack_90 * 0.0 + fStack_80);
        auVar30._12_4_ = (float)(int)(fStack_8c * 0.0 + fStack_7c);
        auVar34._8_8_ = 0;
        auVar34._0_4_ = IVar2.x;
        auVar34._4_4_ = IVar2.y;
        auVar33 = minps(auVar34,auVar30);
        local_b0.x = (float)(~-(uint)(auVar30._0_4_ < fVar26) & auVar33._0_4_ |
                            (uint)fVar26 & -(uint)(auVar30._0_4_ < fVar26));
        local_b0.y = (float)(~-(uint)(auVar30._4_4_ < fVar27) & auVar33._4_4_ |
                            (uint)fVar27 & -(uint)(auVar30._4_4_ < fVar27));
        auVar25._0_4_ =
             (float)(int)(((pIVar4->SizeFull).x + fVar29) * (float)local_98._0_4_ + local_88.x);
        auVar25._4_4_ =
             (float)(int)((((pIVar4->TitleBarHeight + fVar31) - fVar31) * 3.0 + fVar31) *
                          (float)local_98._4_4_ + local_88.y);
        auVar25._8_4_ = (float)(int)(fStack_90 * 0.0 + fStack_80);
        auVar25._12_4_ = (float)(int)(fStack_8c * 0.0 + fStack_7c);
        auVar33 = minps(auVar28,auVar25);
        IStack_38 = (ImVec2)(CONCAT44(~-(uint)(auVar25._4_4_ < fVar27) & auVar33._4_4_,
                                      ~-(uint)(auVar25._0_4_ < fVar26) & auVar33._0_4_) |
                            CONCAT44((uint)fVar27 & -(uint)(auVar25._4_4_ < fVar27),
                                     (uint)fVar26 & -(uint)(auVar25._0_4_ < fVar26)));
        if (local_c8->NavWindow == (ImGuiWindow *)0x0) {
          uVar21 = 10;
        }
        else {
          uVar21 = pIVar4->RootWindowForTitleBarHighlight ==
                   local_c8->NavWindow->RootWindowForTitleBarHighlight | 10;
        }
        pIVar3 = pIVar17->DrawList;
        local_d8.x = (GImGui->Style).Colors[2].x;
        local_d8.y = (GImGui->Style).Colors[2].y;
        uVar7 = (GImGui->Style).Colors[2].z;
        uVar8 = (GImGui->Style).Colors[2].w;
        local_d8.w = (GImGui->Style).Alpha * (float)uVar8;
        local_d8.z = (float)uVar7;
        local_40 = local_b8;
        IVar18 = ColorConvertFloat4ToU32(&local_d8);
        ImDrawList::AddRectFilled(pIVar3,&local_b8,&local_b0,IVar18,0.0,0);
        pIVar3 = pIVar17->DrawList;
        puVar1 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar21 << 4));
        local_d8._0_8_ = *puVar1;
        uVar9 = puVar1[1];
        local_d8.w = (float)((ulong)uVar9 >> 0x20);
        local_d8.z = (float)uVar9;
        local_d8.w = (GImGui->Style).Alpha * local_d8.w;
        IVar18 = ColorConvertFloat4ToU32(&local_d8);
        ImDrawList::AddRectFilled(pIVar3,&local_40,&IStack_38,IVar18,0.0,0);
        pIVar3 = pIVar17->DrawList;
        local_d8.x = (GImGui->Style).Colors[5].x;
        local_d8.y = (GImGui->Style).Colors[5].y;
        uVar10 = (GImGui->Style).Colors[5].z;
        uVar11 = (GImGui->Style).Colors[5].w;
        local_d8.w = (GImGui->Style).Alpha * (float)uVar11;
        local_d8.z = (float)uVar10;
        IVar18 = ColorConvertFloat4ToU32(&local_d8);
        ImDrawList::AddRect(pIVar3,&local_b8,&local_b0,IVar18,0.0,0,1.0);
        pIVar3 = pIVar17->DrawList;
        font = local_c8->Font;
        local_78.x = local_c8->FontSize;
        local_d8.x = (GImGui->Style).Colors[0].x;
        local_d8.y = (GImGui->Style).Colors[0].y;
        uVar12 = (GImGui->Style).Colors[0].z;
        uVar13 = (GImGui->Style).Colors[0].w;
        local_d8.w = (GImGui->Style).Alpha * (float)uVar13;
        local_d8.z = (float)uVar12;
        IVar18 = ColorConvertFloat4ToU32(&local_d8);
        for (text_end = pIVar4->Name; text_end != (char *)0xffffffffffffffff;
            text_end = text_end + 1) {
          if (*text_end == '#') {
            if (text_end[1] == '#') goto LAB_00190ec2;
          }
          else if (*text_end == '\0') goto LAB_00190ec2;
        }
        text_end = (char *)0xffffffffffffffff;
LAB_00190ec2:
        ImDrawList::AddText(pIVar3,font,local_78.x,&local_40,IVar18,pIVar4->Name,text_end,0.0,
                            (ImVec4 *)0x0);
        ppIVar20 = local_48;
        bb = (ImRect *)local_a8;
      }
      ppIVar22 = ppIVar22 + 1;
    } while (ppIVar22 != ppIVar20);
  }
  local_d8.x = (GImGui->Style).Colors[5].x;
  local_d8.y = (GImGui->Style).Colors[5].y;
  uVar14 = (GImGui->Style).Colors[5].z;
  uVar15 = (GImGui->Style).Colors[5].w;
  local_d8.w = (GImGui->Style).Alpha * (float)uVar15;
  local_d8.z = (float)uVar14;
  IVar18 = ColorConvertFloat4ToU32(&local_d8);
  p_max = local_50;
  ImDrawList::AddRect(local_60,&bb->Min,local_50,IVar18,0.0,0,1.0);
  if ((local_58->super_ImGuiViewport).ID == (local_c8->DebugMetricsConfig).HighlightViewportID) {
    ImDrawList::AddRect(local_c0->DrawList,&bb->Min,p_max,0xff00ffff,0.0,0,1.0);
  }
  return;
}

Assistant:

void ImGui::DebugRenderViewportThumbnail(ImDrawList* draw_list, ImGuiViewportP* viewport, const ImRect& bb)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImVec2 scale = bb.GetSize() / viewport->Size;
    ImVec2 off = bb.Min - viewport->Pos * scale;
    float alpha_mul = 1.0f;
    window->DrawList->AddRectFilled(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul * 0.40f));
    for (ImGuiWindow* thumb_window : g.Windows)
    {
        if (!thumb_window->WasActive || (thumb_window->Flags & ImGuiWindowFlags_ChildWindow))
            continue;

        ImRect thumb_r = thumb_window->Rect();
        ImRect title_r = thumb_window->TitleBarRect();
        thumb_r = ImRect(ImTrunc(off + thumb_r.Min * scale), ImTrunc(off +  thumb_r.Max * scale));
        title_r = ImRect(ImTrunc(off + title_r.Min * scale), ImTrunc(off +  ImVec2(title_r.Max.x, title_r.Min.y + title_r.GetHeight() * 3.0f) * scale)); // Exaggerate title bar height
        thumb_r.ClipWithFull(bb);
        title_r.ClipWithFull(bb);
        const bool window_is_focused = (g.NavWindow && thumb_window->RootWindowForTitleBarHighlight == g.NavWindow->RootWindowForTitleBarHighlight);
        window->DrawList->AddRectFilled(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_WindowBg, alpha_mul));
        window->DrawList->AddRectFilled(title_r.Min, title_r.Max, GetColorU32(window_is_focused ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBg, alpha_mul));
        window->DrawList->AddRect(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
        window->DrawList->AddText(g.Font, g.FontSize * 1.0f, title_r.Min, GetColorU32(ImGuiCol_Text, alpha_mul), thumb_window->Name, FindRenderedTextEnd(thumb_window->Name));
    }
    draw_list->AddRect(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
    if (viewport->ID == g.DebugMetricsConfig.HighlightViewportID)
        window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255, 255, 0, 255));
}